

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O2

optional<int> cmCurlParseTLSVersion(string_view tls_version)

{
  bool bVar1;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  ulong uStack_20;
  
  uVar2 = 0x100000000;
  __y._M_str = "1.0";
  __y._M_len = 3;
  bVar1 = std::operator==(tls_version,__y);
  if (bVar1) {
    uStack_20 = 4;
  }
  else {
    __y_00._M_str = "1.1";
    __y_00._M_len = 3;
    bVar1 = std::operator==(tls_version,__y_00);
    if (bVar1) {
      uStack_20 = 5;
    }
    else {
      __y_01._M_str = "1.2";
      __y_01._M_len = 3;
      bVar1 = std::operator==(tls_version,__y_01);
      if (bVar1) {
        uStack_20 = 6;
      }
      else {
        __y_02._M_str = "1.3";
        __y_02._M_len = 3;
        bVar1 = std::operator==(tls_version,__y_02);
        if (!bVar1) {
          uVar2 = 0;
        }
        uStack_20 = 7;
      }
    }
  }
  return (optional<int>)(uStack_20 | uVar2);
}

Assistant:

cm::optional<int> cmCurlParseTLSVersion(cm::string_view tls_version)
{
  cm::optional<int> v;
  if (tls_version == "1.0"_s) {
    v = CURL_SSLVERSION_TLSv1_0;
  } else if (tls_version == "1.1"_s) {
    v = CURL_SSLVERSION_TLSv1_1;
  } else if (tls_version == "1.2"_s) {
    v = CURL_SSLVERSION_TLSv1_2;
  } else if (tls_version == "1.3"_s) {
    v = CURL_SSLVERSION_TLSv1_3;
  }
  return v;
}